

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int should_send_max_streams(quicly_conn_t *conn,int uni)

{
  int iVar1;
  int in_ESI;
  long *in_RDI;
  st_quicly_conn_streamgroup_state_t *group;
  quicly_maxsender_t *maxsender;
  uint64_t concurrency;
  uint32_t *local_30;
  quicly_maxsender_t *local_28;
  long local_20;
  int local_4;
  
  if (in_ESI == 0) {
    local_20 = *(long *)(*in_RDI + 0x48);
    local_28 = (quicly_maxsender_t *)(in_RDI + 0xb3);
    local_30 = (uint32_t *)(in_RDI + 0x4e);
  }
  else {
    local_20 = *(long *)(*in_RDI + 0x50);
    local_28 = (quicly_maxsender_t *)(in_RDI + 0xaf);
    local_30 = (uint32_t *)(in_RDI + 0x50);
  }
  if (local_20 == 0) {
    local_4 = 0;
  }
  else {
    iVar1 = quicly_maxsender_should_send_max(local_28,*(long *)(local_30 + 2) / 4,*local_30,0x300);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static int should_send_max_streams(quicly_conn_t *conn, int uni)
{
    uint64_t concurrency;
    quicly_maxsender_t *maxsender;
    struct st_quicly_conn_streamgroup_state_t *group;

#define INIT_VARS(type)                                                                                                            \
    do {                                                                                                                           \
        concurrency = conn->super.ctx->transport_params.max_streams_##type;                                                        \
        maxsender = &conn->ingress.max_streams.type;                                                                               \
        group = &conn->super.remote.type;                                                                                          \
    } while (0)
    if (uni) {
        INIT_VARS(uni);
    } else {
        INIT_VARS(bidi);
    }
#undef INIT_VARS

    if (concurrency == 0)
        return 0;

    if (!quicly_maxsender_should_send_max(maxsender, group->next_stream_id / 4, group->num_streams, 768))
        return 0;

    return 1;
}